

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Simulator.hpp
# Opt level: O2

void __thiscall Simulator::ClockReg<Simulator::MRegX>::tick(ClockReg<Simulator::MRegX> *this)

{
  int64_t iVar1;
  int64_t iVar2;
  int64_t iVar3;
  uint64_t uVar4;
  InstSet IVar5;
  undefined4 uVar6;
  uint32_t uVar7;
  uint32_t uVar8;
  uint32_t uVar9;
  int32_t iVar10;
  
  if (this->bubble == true) {
    (this->out).opcode = 0;
    (this->out).inst = UNKNOWN;
    this->stall = false;
    this->bubble = false;
    return;
  }
  if (this->stall == true) {
    this->stall = false;
    return;
  }
  uVar7 = (this->in).opcode;
  uVar8 = (this->in).func;
  uVar9 = (this->in).rd;
  iVar10 = (this->in).imm;
  iVar1 = (this->in).val2;
  iVar2 = (this->in).valE;
  iVar3 = (this->in).valE;
  uVar4 = (this->in).pc;
  IVar5 = (this->in).inst;
  uVar6 = *(undefined4 *)&(this->in).field_0x2c;
  (this->out).val2 = (this->in).val2;
  (this->out).valE = iVar3;
  (this->out).pc = uVar4;
  (this->out).inst = IVar5;
  *(undefined4 *)&(this->out).field_0x2c = uVar6;
  (this->out).opcode = uVar7;
  (this->out).func = uVar8;
  (this->out).rd = uVar9;
  (this->out).imm = iVar10;
  (this->out).val2 = iVar1;
  (this->out).valE = iVar2;
  return;
}

Assistant:

void tick() {
            if (bubble) {
                out.opcode = RISCV_GRX::OP_BUBBLE;
                out.inst = RISCV_GRX::UNKNOWN;
                bubble = stall = false;
//                out.stall_count = 0;
            } else if (stall) {
                stall = false;
            } else {
                out = in;
            }
        }